

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void pstack::
     print_container<std::vector<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>,std::allocator<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>>>,pstack::Dwarf::CFI_const*const&>
               (ostream *os,long *container,CFI **ctx)

{
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *puVar1;
  size_t sVar2;
  char *__s;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *field;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *puVar3;
  JSON<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_const_pstack::Dwarf::CFI_*>
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  puVar3 = (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)*container;
  puVar1 = (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)container[1];
  if (puVar3 != puVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      local_40.object = puVar3;
      local_40.context = ctx;
      operator<<(os,&local_40);
      puVar3 = puVar3 + 1;
      __s = ",\n";
    } while (puVar3 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}